

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_smpl.c
# Opt level: O0

int ossl_ec_GFp_simple_ladder_pre(EC_GROUP *group,EC_POINT *r,EC_POINT *s,EC_POINT *p,BN_CTX *ctx)

{
  BIGNUM *r_00;
  int iVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  BIGNUM *t5;
  BIGNUM *t4;
  BIGNUM *t3;
  BIGNUM *t2;
  BIGNUM *t1;
  BN_CTX *ctx_00;
  BIGNUM *r_01;
  BIGNUM *a;
  BIGNUM *r_02;
  int local_4;
  
  r_00 = *(BIGNUM **)(in_RDX + 0x20);
  r_02 = *(BIGNUM **)(in_RSI + 0x20);
  a = *(BIGNUM **)(in_RDX + 0x10);
  r_01 = *(BIGNUM **)(in_RSI + 0x10);
  ctx_00 = *(BN_CTX **)(in_RDX + 0x18);
  if (((((((*(int *)(in_RCX + 0x28) == 0) ||
          (iVar1 = (**(code **)(*in_RDI + 0x100))(in_RDI,a,*(undefined8 *)(in_RCX + 0x10),in_R8),
          iVar1 == 0)) ||
         (iVar1 = BN_mod_sub_quick(r_01,a,(BIGNUM *)in_RDI[0xc],(BIGNUM *)in_RDI[8]), iVar1 == 0))
        || ((iVar1 = (**(code **)(*in_RDI + 0x100))(in_RDI,r_01,r_01,in_R8), iVar1 == 0 ||
            (iVar1 = (**(code **)(*in_RDI + 0xf8))
                               (in_RDI,ctx_00,*(undefined8 *)(in_RCX + 0x10),in_RDI[0xd],in_R8),
            iVar1 == 0)))) ||
       ((iVar1 = BN_mod_lshift_quick((BIGNUM *)ctx_00,(BIGNUM *)ctx_00,3,(BIGNUM *)in_RDI[8]),
        iVar1 == 0 ||
        ((iVar1 = BN_mod_sub_quick(*(BIGNUM **)(in_RSI + 0x10),r_01,(BIGNUM *)ctx_00,
                                   (BIGNUM *)in_RDI[8]), iVar1 == 0 ||
         (iVar1 = BN_mod_add_quick(r_00,a,(BIGNUM *)in_RDI[0xc],(BIGNUM *)in_RDI[8]), iVar1 == 0))))
       )) || (iVar1 = (**(code **)(*in_RDI + 0xf8))
                                (in_RDI,r_02,*(undefined8 *)(in_RCX + 0x10),r_00,in_R8), iVar1 == 0)
      ) || ((iVar1 = BN_mod_add_quick(r_02,(BIGNUM *)in_RDI[0xd],r_02,(BIGNUM *)in_RDI[8]),
            iVar1 == 0 ||
            (iVar1 = BN_mod_lshift_quick(*(BIGNUM **)(in_RSI + 0x20),r_02,2,(BIGNUM *)in_RDI[8]),
            iVar1 == 0)))) {
    local_4 = 0;
  }
  else {
    do {
      iVar1 = BN_priv_rand_range_ex((BIGNUM *)r_02,(BIGNUM *)a,(uint)((ulong)r_01 >> 0x20),ctx_00);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = BN_is_zero(*(BIGNUM **)(in_RSI + 0x18));
    } while (iVar1 != 0);
    do {
      iVar1 = BN_priv_rand_range_ex((BIGNUM *)r_02,(BIGNUM *)a,(uint)((ulong)r_01 >> 0x20),ctx_00);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = BN_is_zero(*(BIGNUM **)(in_RDX + 0x20));
    } while (iVar1 != 0);
    if ((*(long *)(*in_RDI + 0x118) == 0) ||
       ((iVar1 = (**(code **)(*in_RDI + 0x118))
                           (in_RDI,*(undefined8 *)(in_RSI + 0x18),*(undefined8 *)(in_RSI + 0x18),
                            in_R8), iVar1 != 0 &&
        (iVar1 = (**(code **)(*in_RDI + 0x118))
                           (in_RDI,*(undefined8 *)(in_RDX + 0x20),*(undefined8 *)(in_RDX + 0x20),
                            in_R8), iVar1 != 0)))) {
      iVar1 = (**(code **)(*in_RDI + 0xf8))
                        (in_RDI,*(undefined8 *)(in_RSI + 0x20),*(undefined8 *)(in_RSI + 0x20),
                         *(undefined8 *)(in_RSI + 0x18),in_R8);
      if ((iVar1 == 0) ||
         ((iVar1 = (**(code **)(*in_RDI + 0xf8))
                             (in_RDI,*(undefined8 *)(in_RSI + 0x10),*(undefined8 *)(in_RSI + 0x10),
                              *(undefined8 *)(in_RSI + 0x18),in_R8), iVar1 == 0 ||
          (iVar1 = (**(code **)(*in_RDI + 0xf8))
                             (in_RDI,*(undefined8 *)(in_RDX + 0x10),*(undefined8 *)(in_RCX + 0x10),
                              *(undefined8 *)(in_RDX + 0x20),in_R8), iVar1 == 0)))) {
        local_4 = 0;
      }
      else {
        *(undefined4 *)(in_RSI + 0x28) = 0;
        *(undefined4 *)(in_RDX + 0x28) = 0;
        local_4 = 1;
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ossl_ec_GFp_simple_ladder_pre(const EC_GROUP *group,
                                  EC_POINT *r, EC_POINT *s,
                                  EC_POINT *p, BN_CTX *ctx)
{
    BIGNUM *t1, *t2, *t3, *t4, *t5 = NULL;

    t1 = s->Z;
    t2 = r->Z;
    t3 = s->X;
    t4 = r->X;
    t5 = s->Y;

    if (!p->Z_is_one /* r := 2p */
        || !group->meth->field_sqr(group, t3, p->X, ctx)
        || !BN_mod_sub_quick(t4, t3, group->a, group->field)
        || !group->meth->field_sqr(group, t4, t4, ctx)
        || !group->meth->field_mul(group, t5, p->X, group->b, ctx)
        || !BN_mod_lshift_quick(t5, t5, 3, group->field)
        /* r->X coord output */
        || !BN_mod_sub_quick(r->X, t4, t5, group->field)
        || !BN_mod_add_quick(t1, t3, group->a, group->field)
        || !group->meth->field_mul(group, t2, p->X, t1, ctx)
        || !BN_mod_add_quick(t2, group->b, t2, group->field)
        /* r->Z coord output */
        || !BN_mod_lshift_quick(r->Z, t2, 2, group->field))
        return 0;

    /* make sure lambda (r->Y here for storage) is not zero */
    do {
        if (!BN_priv_rand_range_ex(r->Y, group->field, 0, ctx))
            return 0;
    } while (BN_is_zero(r->Y));

    /* make sure lambda (s->Z here for storage) is not zero */
    do {
        if (!BN_priv_rand_range_ex(s->Z, group->field, 0, ctx))
            return 0;
    } while (BN_is_zero(s->Z));

    /* if field_encode defined convert between representations */
    if (group->meth->field_encode != NULL
        && (!group->meth->field_encode(group, r->Y, r->Y, ctx)
            || !group->meth->field_encode(group, s->Z, s->Z, ctx)))
        return 0;

    /* blind r and s independently */
    if (!group->meth->field_mul(group, r->Z, r->Z, r->Y, ctx)
        || !group->meth->field_mul(group, r->X, r->X, r->Y, ctx)
        || !group->meth->field_mul(group, s->X, p->X, s->Z, ctx)) /* s := p */
        return 0;

    r->Z_is_one = 0;
    s->Z_is_one = 0;

    return 1;
}